

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt6MinBase(word *pTruth,int *pVars,int nVars)

{
  int iVar1;
  int local_38;
  int local_34;
  int k;
  int i;
  word t;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  
  _k = *pTruth;
  local_38 = 0;
  for (local_34 = 0; local_34 < nVars; local_34 = local_34 + 1) {
    iVar1 = Abc_Tt6HasVar(_k,local_34);
    if (iVar1 != 0) {
      if (local_38 < local_34) {
        if (pVars != (int *)0x0) {
          pVars[local_38] = pVars[local_34];
        }
        _k = Abc_Tt6SwapVars(_k,local_38,local_34);
      }
      local_38 = local_38 + 1;
    }
  }
  if (local_38 != nVars) {
    if (nVars <= local_38) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x5b6,"int Abc_Tt6MinBase(word *, int *, int)");
    }
    *pTruth = _k;
  }
  return local_38;
}

Assistant:

static inline int Abc_Tt6MinBase( word * pTruth, int * pVars, int nVars ) 
{
    word t = *pTruth;
    int i, k;
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_Tt6HasVar( t, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            t = Abc_Tt6SwapVars( t, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
    *pTruth = t;
    return k;
}